

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O1

u32 __thiscall moira::Moira::mul<(moira::Instr)80>(Moira *this,u32 op1,u32 op2)

{
  uint uVar1;
  ushort uVar2;
  u32 uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar3 = (int)(short)op2 * (int)(short)op1;
  (this->reg).sr.n = SUB41(uVar3 >> 0x1f,0);
  (this->reg).sr.z = uVar3 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  if ((short)op1 == 0) {
    uVar5 = 0x22;
  }
  else {
    iVar4 = 0x11;
    uVar1 = op1 * 2 ^ op1;
    do {
      iVar4 = iVar4 + (uVar1 & 1);
      uVar2 = (ushort)uVar1;
      uVar1 = (uVar1 & 0xffff) >> 1;
    } while (1 < uVar2);
    uVar5 = (ulong)(uint)(iVar4 * 2);
  }
  (*this->_vptr_Moira[0x19])(this,uVar5);
  return uVar3;
}

Assistant:

u32
Moira::mul(u32 op1, u32 op2)
{
    u32 result;

    switch (I) {

         case MULS:
         {
             result = (i16)op1 * (i16)op2;
             break;
         }
         case MULU:
         {
             result = op1 * op2;
             break;
         }
        default: assert(false);
     }

    reg.sr.n = NBIT<Long>(result);
    reg.sr.z = ZERO<Long>(result);
    reg.sr.v = 0;
    reg.sr.c = 0;

    sync(cyclesMul<I>(op1));
    return result;
}